

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O2

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_0UL> *this,executor_function *f)

{
  impl_base *piVar1;
  bool bVar2;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *op;
  function_type tmp;
  
  if (((this->target_ & 1) == 0) &&
     (bVar2 = asio::detail::scheduler::can_dispatch
                        (*(scheduler **)((this->target_ & 0xfffffffffffffffc) + 8)), bVar2)) {
    piVar1 = (impl_base *)f->impl_;
    f->impl_ = (impl_base *)0x0;
    tmp.impl_ = (impl_base *)piVar1;
    if (piVar1 != (impl_base *)0x0) {
      tmp.impl_ = (impl_base *)0x0;
      (*piVar1->complete_)(piVar1,true);
    }
    asio::detail::executor_function::~executor_function((executor_function *)&tmp);
    return;
  }
  tmp.impl_ = (impl_base *)this;
  op = asio::detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::ptr::allocate((allocator<void> *)this);
  (op->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (op->super_scheduler_operation).func_ =
       asio::detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (op->super_scheduler_operation).task_result_ = 0;
  (op->handler_).impl_ = f->impl_;
  f->impl_ = (impl_base *)0x0;
  asio::detail::scheduler::post_immediate_completion
            (*(scheduler **)((this->target_ & 0xfffffffffffffffc) + 8),
             &op->super_scheduler_operation,SUB41(((uint)this->target_ & 2) >> 1,0));
  asio::detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)&tmp);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    Function&& f) const
{
  typedef decay_t<Function> function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(static_cast<Function&&>(f));

#if !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      static_cast<function_type&&>(tmp)();
      return;
#if !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(static_cast<Function&&>(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}